

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O0

void __thiscall iqxmlrpc::Pool_executor_factory::add_threads(Pool_executor_factory *this,uint num)

{
  Pool_thread *this_00;
  Pool_thread threadfunc;
  Pool_thread *local_20;
  Pool_thread *t;
  uint i;
  uint num_local;
  Pool_executor_factory *this_local;
  
  t._4_4_ = num;
  _i = this;
  for (t._0_4_ = 0; (uint)t < t._4_4_; t._0_4_ = (uint)t + 1) {
    this_00 = (Pool_thread *)operator_new(0x10);
    Pool_thread::Pool_thread(this_00,(uint)t,this);
    local_20 = this_00;
    std::
    vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
    ::push_back(&this->pool,&local_20);
    threadfunc._0_8_ = *(ulong *)local_20 & 0xffffffff;
    threadfunc.pool = local_20->pool;
    boost::thread_group::create_thread<iqxmlrpc::Pool_executor_factory::Pool_thread>
              (&this->threads,threadfunc);
  }
  return;
}

Assistant:

void Pool_executor_factory::add_threads( unsigned num )
{
  for( unsigned i = 0; i < num; ++i )
  {
    Pool_thread* t = new Pool_thread(i, this);
    pool.push_back(t);
    threads.create_thread(*t);
  }
}